

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedmemory.cpp
# Opt level: O0

void __thiscall QSharedMemoryPrivate::~QSharedMemoryPrivate(QSharedMemoryPrivate *this)

{
  QNativeIpcKey *in_RDI;
  QObjectPrivate *in_stack_00000030;
  
  (((unique_ptr<QSystemSemaphorePrivate,_std::default_delete<QSystemSemaphorePrivate>_> *)&in_RDI->d
   )->_M_t).
  super___uniq_ptr_impl<QSystemSemaphorePrivate,_std::default_delete<QSystemSemaphorePrivate>_>._M_t
  .super__Tuple_impl<0UL,_QSystemSemaphorePrivate_*,_std::default_delete<QSystemSemaphorePrivate>_>.
  super__Head_base<0UL,_QSystemSemaphorePrivate_*,_false>._M_head_impl =
       (QSystemSemaphorePrivate *)&PTR__QSharedMemoryPrivate_00be22f8;
  destructBackend((QSharedMemoryPrivate *)0x25faf6);
  QtIpcCommon::
  IpcStorageVariant<&QSharedMemoryPrivate::Backend::posix,_&QSharedMemoryPrivate::Backend::sysv,_&QSharedMemoryPrivate::Backend::win32>
  ::~IpcStorageVariant
            ((IpcStorageVariant<&QSharedMemoryPrivate::Backend::posix,_&QSharedMemoryPrivate::Backend::sysv,_&QSharedMemoryPrivate::Backend::win32>
              *)0x25fb09);
  QSystemSemaphore::~QSystemSemaphore((QSystemSemaphore *)in_RDI);
  QString::~QString((QString *)0x25fb2b);
  QNativeIpcKey::~QNativeIpcKey(in_RDI);
  QObjectPrivate::~QObjectPrivate(in_stack_00000030);
  return;
}

Assistant:

QSharedMemoryPrivate::~QSharedMemoryPrivate()
{
    destructBackend();
}